

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_remove_all_buffer_blocks(filemgr *file)

{
  if ((0 < global_config.ncacheblock) && ((file->bcache)._M_b._M_p != (__pointer_type)0x0)) {
    bcache_remove_dirty_blocks(file);
    bcache_remove_clean_blocks(file);
    bcache_remove_file(file);
    (file->bcache)._M_b._M_p = (__pointer_type)0x0;
  }
  return;
}

Assistant:

void filemgr_remove_all_buffer_blocks(struct filemgr *file)
{
    // remove all cached blocks
    if (global_config.ncacheblock > 0 &&
            file->bcache.load(std::memory_order_relaxed)) {
        bcache_remove_dirty_blocks(file);
        bcache_remove_clean_blocks(file);
        bcache_remove_file(file);
        file->bcache.store(NULL, std::memory_order_relaxed);
    }
}